

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void Assimp::FBX::Node::WritePropertyNodeAscii
               (string *name,vector<int,_std::allocator<int>_> *v,StreamWriterLE *s,int indent)

{
  uint uVar1;
  pointer piVar2;
  DeadlyImportError *this;
  int i;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  allocator local_10d;
  int local_10c;
  string local_108;
  string vsize;
  char buffer [32];
  Node node;
  
  Node(&node,name);
  Begin(&node,s,false,indent);
  to_string<unsigned_long>
            (&vsize,(long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  StreamWriter<false,_false>::Put<char>(s,'*');
  StreamWriter<false,_false>::PutString(s,&vsize);
  std::__cxx11::string::string((string *)&local_108," {\n",&local_10d);
  StreamWriter<false,_false>::PutString(s,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  for (iVar3 = 0; iVar3 <= indent; iVar3 = iVar3 + 1) {
    StreamWriter<false,_false>::Put<char>(s,'\t');
  }
  std::__cxx11::string::string((string *)&local_108,"a: ",&local_10d);
  local_10c = indent;
  StreamWriter<false,_false>::PutString(s,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  iVar3 = 0;
  uVar6 = 0;
  while( true ) {
    piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar6) {
      StreamWriter<false,_false>::Put<char>(s,'\n');
      iVar3 = local_10c;
      iVar4 = 0;
      if (0 < local_10c) {
        iVar4 = local_10c;
      }
      while (iVar4 != 0) {
        StreamWriter<false,_false>::Put<char>(s,'\t');
        iVar4 = iVar4 + -1;
      }
      StreamWriter<false,_false>::Put<char>(s,'}');
      StreamWriter<false,_false>::Put<char>(s,' ');
      End(&node,s,false,iVar3,false);
      std::__cxx11::string::~string((string *)&vsize);
      ~Node(&node);
      return;
    }
    if (uVar6 != 0) {
      StreamWriter<false,_false>::Put<char>(s,',');
      piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    uVar1 = snprintf(buffer,0x20,"%d",(ulong)(uint)piVar2[uVar6]);
    iVar3 = iVar3 + uVar1;
    if (0x800 < iVar3) {
      iVar3 = 0;
      StreamWriter<false,_false>::Put<char>(s,'\n');
    }
    if (0x1f < uVar1) break;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<char>(s,buffer[uVar5]);
    }
    uVar6 = uVar6 + 1;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_108,"failed to convert double to string",&local_10d)
  ;
  DeadlyImportError::DeadlyImportError(this,&local_108);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FBX::Node::WritePropertyNodeAscii(
    const std::string& name,
    const std::vector<int32_t>& v,
    Assimp::StreamWriterLE& s,
    int indent
){
    char buffer[32];
    FBX::Node node(name);
    node.Begin(s, false, indent);
    std::string vsize = to_string(v.size());
    // *<size> {
    s.PutChar('*'); s.PutString(vsize); s.PutString(" {\n");
    // indent + 1
    for (int i = 0; i < indent + 1; ++i) { s.PutChar('\t'); }
    // a: value,value,value,...
    s.PutString("a: ");
    int count = 0;
    for (size_t i = 0; i < v.size(); ++i) {
        if (i > 0) { s.PutChar(','); }
        int len = ai_snprintf(buffer, sizeof(buffer), "%d", v[i]);
        count += len;
        if (count > 2048) { s.PutChar('\n'); count = 0; }
        if (len < 0 || len > 31) {
            // this should never happen
            throw DeadlyExportError("failed to convert double to string");
        }
        for (int j = 0; j < len; ++j) { s.PutChar(buffer[j]); }
    }
    // }
    s.PutChar('\n');
    for (int i = 0; i < indent; ++i) { s.PutChar('\t'); }
    s.PutChar('}'); s.PutChar(' ');
    node.End(s, false, indent, false);
}